

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

int doctest::detail::nameOrderComparator(void *a,void *b)

{
  int res;
  TestData *rhs;
  TestData *lhs;
  void *b_local;
  void *a_local;
  
  a_local._4_4_ = strcmp(*(char **)(*a + 8),*(char **)(*b + 8));
  if (a_local._4_4_ == 0) {
    a_local._4_4_ = suiteOrderComparator(a,b);
  }
  return a_local._4_4_;
}

Assistant:

int nameOrderComparator(const void* a, const void* b) {
        const TestData* lhs = *static_cast<TestData* const*>(a);
        const TestData* rhs = *static_cast<TestData* const*>(b);

        int res = strcmp(lhs->m_name, rhs->m_name);
        if(res != 0)
            return res;
        return suiteOrderComparator(a, b);
    }